

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 mouse_pos;
  char *name;
  int column_n;
  int columns_count;
  float row_height;
  float row_y1;
  ImGuiTable *table;
  ImGuiContext *g;
  char *in_stack_000000e0;
  ImGuiTable *in_stack_000000f0;
  char *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  float fVar8;
  char *in_stack_ffffffffffffffd0;
  int column_n_00;
  int local_28;
  float fStack_18;
  
  pIVar1 = GImGui->CurrentTable;
  if ((pIVar1->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(in_stack_000000f0);
  }
  IVar7 = GetCursorScreenPos();
  fStack_18 = IVar7.y;
  fVar6 = TableGetHeaderRowHeight();
  TableNextRow((ImGuiTableRowFlags)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB84(in_stack_ffffffffffffffc0,0));
  if ((pIVar1->HostSkipItems & 1U) == 0) {
    iVar3 = TableGetColumnCount();
    for (local_28 = 0; column_n_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
        local_28 < iVar3; local_28 = local_28 + 1) {
      bVar2 = TableSetColumnIndex((int)in_stack_ffffffffffffffc0);
      if (bVar2) {
        uVar4 = TableGetColumnFlags((int)in_stack_ffffffffffffffc0);
        if ((uVar4 & 0x1000) == 0) {
          in_stack_ffffffffffffffc0 =
               TableGetColumnName((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        }
        else {
          in_stack_ffffffffffffffc0 = "";
        }
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc0;
        PushID((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        TableHeader(in_stack_000000e0);
        PopID();
      }
    }
    IVar7 = GetMousePos();
    fVar8 = IVar7.y;
    bVar2 = IsMouseReleased(1);
    if ((((bVar2) && (iVar5 = TableGetHoveredColumn(), iVar5 == iVar3)) && (fStack_18 <= fVar8)) &&
       (fVar8 < fStack_18 + fVar6)) {
      TableOpenContextMenu(column_n_00);
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}